

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::forward
          (DeconvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  int iVar8;
  int *piVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  Layer *pLVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined8 uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  _func_int *p_Var41;
  Allocator *pAVar42;
  Allocator *pAVar43;
  Allocator *pAVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  Allocator *pAVar48;
  _func_int ***ppp_Var49;
  _func_int *p_Var50;
  int iVar51;
  int iVar52;
  uint _w;
  uint uVar53;
  int iVar54;
  uint _h;
  float *pfVar55;
  size_t sVar56;
  ulong uVar57;
  ulong uVar58;
  int iVar59;
  Allocator *pAVar60;
  uint uVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar68 [28];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar74;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar93;
  float fVar94;
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar76 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar95;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar116 [16];
  float fVar115;
  float fVar128;
  undefined1 auVar119 [16];
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [64];
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar155 [64];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar171 [64];
  float fVar177;
  float fVar182;
  undefined1 auVar178 [16];
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [32];
  void *local_288;
  undefined1 local_238 [56];
  int local_200;
  size_t local_1f8;
  Allocator *local_1f0;
  Allocator *local_1e8;
  _func_int **local_1e0;
  Option opt_p;
  Mat local_178;
  void *local_130;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar6;
  float fVar17;
  float fVar20;
  float fVar23;
  undefined1 auVar88 [32];
  undefined1 auVar92 [32];
  undefined1 auVar125 [32];
  
  iVar52 = bottom_blob->w;
  iVar59 = bottom_blob->h;
  uVar58 = bottom_blob->elemsize;
  iVar8 = bottom_blob->elempack;
  p_Var41 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  if (opt->use_packing_layout == true) {
    uVar53 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var41) & 3) == 0) * 3 + 1;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var41) & 7) == 0) {
      uVar53 = 8;
    }
  }
  else {
    uVar53 = 1;
  }
  iVar46 = (*(int *)(&this->field_0xd4 + (long)p_Var41) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var41);
  iVar36 = *(int *)(&this->field_0xe4 + (long)p_Var41);
  iVar47 = (*(int *)(&this->field_0xd8 + (long)p_Var41) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var41);
  iVar35 = *(int *)(&this->field_0xe8 + (long)p_Var41);
  iVar51 = *(int *)(&this->field_0xfc + (long)p_Var41);
  iVar54 = *(int *)(&this->field_0x100 + (long)p_Var41);
  uVar61 = bottom_blob->c;
  pAVar42 = (Allocator *)(ulong)uVar61;
  local_1f8 = 0;
  local_238._0_8_ = (Allocator *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_238._24_4_ = 0;
  p_Var50 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
  p_Var41 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx + (long)p_Var50);
  lVar45 = 0x10;
  local_238._32_8_ = local_238._0_8_;
  local_238._40_4_ = local_238._8_4_;
  local_238._44_4_ = local_238._12_4_;
  local_238._48_8_ = local_238._16_8_;
  local_200 = local_238._24_4_;
  if ((((*(int *)(&this->field_0xec + (long)p_Var50) < 1) && (*(int *)(p_Var41 + 0xf0) < 1)) &&
      (*(int *)(p_Var41 + 0xf4) < 1)) &&
     ((*(int *)(p_Var41 + 0xf8) < 1 &&
      ((*(int *)(p_Var41 + 0x104) < 1 || (*(int *)(p_Var41 + 0x108) < 1)))))) {
    if ((Mat *)local_238 != top_blob) {
      piVar9 = top_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      local_238._0_8_ = top_blob->data;
      local_238._8_4_ = SUB84(top_blob->refcount,0);
      local_238._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_238._16_8_ = top_blob->elemsize;
      local_238._24_4_ = top_blob->elempack;
      local_238._32_8_ = top_blob->allocator;
      uVar3 = top_blob->dims;
      uVar4 = top_blob->w;
      uVar5 = top_blob->h;
      uVar7 = top_blob->d;
      uVar6 = CONCAT44(uVar7,uVar5);
      local_200 = top_blob->c;
      local_1f8 = top_blob->cstep;
      p_Var50 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
      local_238._40_4_ = uVar3;
      local_238._44_4_ = uVar4;
      local_238._48_8_ = uVar6;
    }
    p_Var41 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx + (long)p_Var50);
    lVar45 = 8;
  }
  _w = iVar51 + (iVar52 + -1) * iVar36 + iVar46 + 1;
  _h = iVar54 + (iVar59 + -1) * iVar35 + iVar47 + 1;
  sVar56 = (uVar58 / (ulong)(long)iVar8) * (ulong)uVar53;
  Mat::create((Mat *)local_238,_w,_h,*(int *)(p_Var41 + 0xd0) / (int)uVar53,sVar56,uVar53,
              *(Allocator **)(&opt->lightmode + lVar45));
  if (((Allocator *)local_238._0_8_ != (Allocator *)0x0) && ((long)local_200 * local_1f8 != 0)) {
    p_Var41 = this->_vptr_DeconvolutionDepthWise_x86_avx[-3];
    iVar35 = iVar8 * uVar61;
    iVar36 = *(int *)(&this->field_0x114 + (long)p_Var41);
    if ((iVar35 == iVar36) && (iVar35 == *(int *)(&this->field_0xd0 + (long)p_Var41))) {
      iVar36 = *(int *)(&this->field_0xd8 + (long)p_Var41) *
               *(int *)(&this->field_0xd4 + (long)p_Var41);
      if (iVar8 == 1) {
        if ((int)_w < 1) {
          _w = 0;
        }
        pAVar43 = (Allocator *)0x0;
        pAVar60 = (Allocator *)(ulong)_h;
        if ((int)_h < 1) {
          pAVar60 = pAVar43;
        }
        if ((int)uVar61 < 1) {
          pAVar42 = pAVar43;
        }
        local_1f0 = (Allocator *)local_238._0_8_;
        lVar45 = local_1f8 * local_238._16_8_;
        local_288 = (this->weight_data_tm).data;
        iVar8 = bottom_blob->w;
        local_130 = bottom_blob->data;
        sVar56 = bottom_blob->elemsize;
        sVar10 = bottom_blob->cstep;
        for (; pvVar11 = local_130, pAVar43 != pAVar42;
            pAVar43 = (Allocator *)((long)&pAVar43->_vptr_Allocator + 1)) {
          ppp_Var49 = (_func_int ***)((long)&local_1f0->_vptr_Allocator + lVar45 * (long)pAVar43);
          iVar35 = 0;
          while (iVar35 != (int)pAVar60) {
            local_1e0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
            local_1e8 = (Allocator *)CONCAT44(local_1e8._4_4_,iVar35);
            for (uVar53 = 0; uVar53 != _w; uVar53 = uVar53 + 1) {
              p_Var41 = local_1e0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var41) == 0) {
                auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar64 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var41) +
                                           (long)pAVar43 * 4));
              }
              iVar54 = 0;
              iVar51 = *(int *)(&this->field_0xd8 + (long)p_Var41);
              if (*(int *)(&this->field_0xd8 + (long)p_Var41) < 1) {
                iVar51 = iVar54;
              }
              for (; iVar54 != iVar51; iVar54 = iVar54 + 1) {
                iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var41) * iVar54 + (iVar35 - iVar47);
                if (((-1 < iVar37) &&
                    (iVar38 = iVar37 / *(int *)(&this->field_0xe8 + (long)p_Var41),
                    iVar37 % *(int *)(&this->field_0xe8 + (long)p_Var41) == 0)) && (iVar38 < iVar59)
                   ) {
                  uVar61 = *(uint *)(&this->field_0xd4 + (long)p_Var41);
                  uVar58 = 0;
                  if (0 < (int)uVar61) {
                    uVar58 = (ulong)uVar61;
                  }
                  for (uVar57 = 0; uVar58 != uVar57; uVar57 = uVar57 + 1) {
                    iVar37 = *(int *)(&this->field_0xdc + (long)p_Var41) * (int)uVar57 +
                             (uVar53 - iVar46);
                    if (((-1 < iVar37) &&
                        (iVar39 = iVar37 / *(int *)(&this->field_0xe4 + (long)p_Var41),
                        iVar37 % *(int *)(&this->field_0xe4 + (long)p_Var41) == 0)) &&
                       (iVar39 < iVar52)) {
                      auVar64 = ZEXT464((uint)(*(float *)((long)local_288 +
                                                         uVar57 * 4 +
                                                         (long)(int)(uVar61 * iVar54) * 4) *
                                               *(float *)((long)pvVar11 +
                                                         (long)iVar39 * 4 +
                                                         (long)iVar38 * (long)iVar8 * sVar56 +
                                                         sVar10 * sVar56 * (long)pAVar43) +
                                              auVar64._0_4_));
                    }
                  }
                }
              }
              auVar76 = auVar64._0_16_;
              fVar62 = auVar64._0_4_;
              fVar186 = fVar62;
              switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var41)) {
              case 1:
                auVar76 = vmaxss_avx(auVar76,ZEXT416(0));
                fVar186 = auVar76._0_4_;
                break;
              case 2:
                auVar76 = vcmpss_avx(ZEXT816(0) << 0x40,auVar76,1);
                auVar87._8_4_ = 0x3f800000;
                auVar87._0_8_ = 0x3f8000003f800000;
                auVar87._12_4_ = 0x3f800000;
                auVar76 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var41)),
                                        auVar87,auVar76);
                fVar186 = auVar76._0_4_ * fVar62;
                break;
              case 3:
                fVar62 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var41))[1];
                auVar76 = vmaxss_avx(auVar76,ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var41)
                                                    ));
                fVar186 = auVar76._0_4_;
                if (fVar62 < auVar76._0_4_) {
                  fVar186 = fVar62;
                }
                break;
              case 4:
                auVar76 = vminss_avx(auVar76,ZEXT416(0x42b0c0a5));
                auVar116._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar116._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar116._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar76 = vcmpss_avx(auVar76,ZEXT416(0xc2b0c0a5),1);
                auVar63._8_4_ = 0x42b0c0a5;
                auVar63._0_8_ = 0x42b0c0a542b0c0a5;
                auVar63._12_4_ = 0x42b0c0a5;
                auVar76 = vblendvps_avx(auVar116,auVar63,auVar76);
                fVar186 = expf(auVar76._0_4_);
                fVar186 = 1.0 / (fVar186 + 1.0);
                break;
              case 5:
                fVar186 = expf(fVar62);
                fVar186 = logf(fVar186 + 1.0);
                fVar186 = tanhf(fVar186);
                fVar186 = fVar186 * fVar62;
                break;
              case 6:
                fVar14 = **(float **)(&this->field_0x120 + (long)p_Var41);
                fVar192 = (*(float **)(&this->field_0x120 + (long)p_Var41))[1];
                fVar95 = -fVar192 / fVar14;
                fVar186 = 0.0;
                if ((fVar95 <= fVar62) && (fVar186 = fVar62, fVar62 <= fVar95 + 1.0 / fVar14)) {
                  fVar186 = (fVar14 * fVar62 + fVar192) * fVar62;
                }
              }
              *(float *)ppp_Var49 = fVar186;
              ppp_Var49 = (_func_int ***)((long)ppp_Var49 + 4);
            }
            iVar35 = (int)local_1e8 + 1;
          }
          local_288 = (void *)((long)local_288 + (long)iVar36 * 4);
        }
      }
      else if (iVar8 == 4) {
        if ((int)_w < 1) {
          _w = 0;
        }
        if ((int)_h < 1) {
          _h = 0;
        }
        if ((int)uVar61 < 1) {
          pAVar42 = (Allocator *)0x0;
        }
        auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar111 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar108 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        pAVar60 = (Allocator *)0x0;
        pAVar43 = (Allocator *)0x0;
        while (pAVar48 = pAVar43, pAVar44 = pAVar60, pAVar44 != pAVar42) {
          iVar35 = (int)pAVar48;
          ppp_Var49 = (_func_int ***)
                      ((long)(_func_int ***)local_238._0_8_ +
                      local_1f8 * (long)pAVar44 * local_238._16_8_);
          iVar8 = bottom_blob->w;
          sVar56 = bottom_blob->cstep;
          sVar10 = bottom_blob->elemsize;
          pvVar11 = bottom_blob->data;
          pvVar12 = (this->weight_data_tm).data;
          for (uVar53 = 0; uVar53 != _h; uVar53 = uVar53 + 1) {
            local_1e0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
            for (uVar61 = 0; uVar61 != _w; uVar61 = uVar61 + 1) {
              p_Var41 = local_1e0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var41) == 0) {
                auVar76 = ZEXT816(0) << 0x40;
              }
              else {
                auVar76 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x1b0 + (long)p_Var41) + (long)pAVar44 * 0x10);
              }
              auVar114 = ZEXT1664(auVar76);
              iVar54 = 0;
              iVar51 = *(int *)(&this->field_0xd8 + (long)p_Var41);
              if (*(int *)(&this->field_0xd8 + (long)p_Var41) < 1) {
                iVar51 = iVar54;
              }
              for (; iVar54 != iVar51; iVar54 = iVar54 + 1) {
                iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var41) * iVar54 + (uVar53 - iVar47);
                if (((-1 < iVar37) &&
                    (iVar38 = iVar37 / *(int *)(&this->field_0xe8 + (long)p_Var41),
                    iVar37 % *(int *)(&this->field_0xe8 + (long)p_Var41) == 0)) && (iVar38 < iVar59)
                   ) {
                  uVar40 = *(uint *)(&this->field_0xd4 + (long)p_Var41);
                  uVar58 = 0;
                  if (0 < (int)uVar40) {
                    uVar58 = (ulong)uVar40;
                  }
                  pfVar55 = (float *)((long)pvVar12 +
                                     (long)(int)(uVar40 * iVar54) * 0x10 + (long)iVar35 * 4);
                  for (uVar57 = 0; uVar58 != uVar57; uVar57 = uVar57 + 1) {
                    iVar37 = *(int *)(&this->field_0xdc + (long)p_Var41) * (int)uVar57 +
                             (uVar61 - iVar46);
                    if (((-1 < iVar37) &&
                        (iVar39 = iVar37 / *(int *)(&this->field_0xe4 + (long)p_Var41),
                        iVar37 % *(int *)(&this->field_0xe4 + (long)p_Var41) == 0)) &&
                       (iVar39 < iVar52)) {
                      pfVar1 = (float *)((long)pvVar11 +
                                        (long)(iVar39 << 2) * 4 +
                                        (long)iVar38 * (long)iVar8 * sVar10 +
                                        sVar56 * (long)pAVar44 * sVar10);
                      auVar114 = ZEXT1664(CONCAT412(pfVar55[3] * pfVar1[3] + auVar114._12_4_,
                                                    CONCAT48(pfVar55[2] * pfVar1[2] + auVar114._8_4_
                                                             ,CONCAT44(pfVar55[1] * pfVar1[1] +
                                                                       auVar114._4_4_,
                                                                       *pfVar55 * *pfVar1 +
                                                                       auVar114._0_4_))));
                    }
                    pfVar55 = pfVar55 + 4;
                  }
                }
              }
              auVar116 = auVar114._0_16_;
              auVar76 = auVar116;
              if (5 < *(int *)(&this->field_0x118 + (long)p_Var41) - 1U)
              goto switchD_003dddcd_caseD_1;
              auVar63 = auVar64._0_16_;
              auVar76 = vmaxps_avx(auVar116,auVar63);
              auVar87 = auVar108._0_16_;
              fVar62 = auVar111._4_4_;
              fVar192 = auVar111._8_4_;
              fVar18 = auVar111._12_4_;
              fVar146 = auVar111._0_4_;
              fVar186 = auVar108._0_4_;
              fVar14 = auVar108._4_4_;
              fVar95 = auVar108._8_4_;
              fVar21 = auVar108._12_4_;
              fVar193 = auVar114._8_4_;
              fVar74 = auVar114._12_4_;
              switch(*(int *)(&this->field_0x118 + (long)p_Var41)) {
              case 2:
                auVar116 = vminps_avx(auVar116,auVar63);
                fVar186 = **(float **)(&this->field_0x120 + (long)p_Var41);
                auVar132._0_4_ = fVar186 * auVar116._0_4_ + auVar76._0_4_;
                auVar132._4_4_ = fVar186 * auVar116._4_4_ + auVar76._4_4_;
                auVar132._8_4_ = fVar186 * auVar116._8_4_ + auVar76._8_4_;
                auVar132._12_4_ = fVar186 * auVar116._12_4_ + auVar76._12_4_;
                auVar76 = auVar132;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var41);
                auVar137._4_4_ = uVar2;
                auVar137._0_4_ = uVar2;
                auVar137._8_4_ = uVar2;
                auVar137._12_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var41))[1];
                auVar189._4_4_ = uVar2;
                auVar189._0_4_ = uVar2;
                auVar189._8_4_ = uVar2;
                auVar189._12_4_ = uVar2;
                auVar76 = vmaxps_avx(auVar116,auVar137);
                auVar76 = vminps_avx(auVar189,auVar76);
                break;
              case 4:
                auVar65._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
                auVar65._8_4_ = -fVar193;
                auVar65._12_4_ = -fVar74;
                auVar84._8_4_ = 0x42b0c0a5;
                auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                auVar84._12_4_ = 0x42b0c0a5;
                auVar76 = vminps_avx(auVar65,auVar84);
                auVar85._8_4_ = 0xc2b0c0a5;
                auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar85._12_4_ = 0xc2b0c0a5;
                auVar63 = vmaxps_avx(auVar76,auVar85);
                auVar138._0_4_ = fVar146 + auVar63._0_4_ * 1.442695;
                auVar138._4_4_ = fVar62 + auVar63._4_4_ * 1.442695;
                auVar138._8_4_ = fVar192 + auVar63._8_4_ * 1.442695;
                auVar138._12_4_ = fVar18 + auVar63._12_4_ * 1.442695;
                auVar190._0_4_ = (int)auVar138._0_4_;
                auVar190._4_4_ = (int)auVar138._4_4_;
                auVar190._8_4_ = (int)auVar138._8_4_;
                auVar190._12_4_ = (int)auVar138._12_4_;
                auVar116 = vcvtdq2ps_avx(auVar190);
                auVar76 = vcmpps_avx(auVar138,auVar116,1);
                auVar76 = vandps_avx(auVar76,auVar87);
                auVar76 = vsubps_avx(auVar116,auVar76);
                fVar193 = auVar76._0_4_ * -0.6931472 + auVar63._0_4_;
                fVar74 = auVar76._4_4_ * -0.6931472 + auVar63._4_4_;
                fVar194 = auVar76._8_4_ * -0.6931472 + auVar63._8_4_;
                fVar93 = auVar76._12_4_ * -0.6931472 + auVar63._12_4_;
                auVar139._0_4_ = (int)auVar76._0_4_;
                auVar139._4_4_ = (int)auVar76._4_4_;
                auVar139._8_4_ = (int)auVar76._8_4_;
                auVar139._12_4_ = (int)auVar76._12_4_;
                auVar76 = vpslld_avx(auVar139,0x17);
                auVar76 = vpaddd_avx(auVar76,auVar87);
                auVar66._0_4_ =
                     (fVar193 * fVar193 *
                      (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) *
                         fVar193 + 0.041665796) * fVar193 + 0.16666666) * fVar193 + fVar146) +
                     fVar193 + fVar186) * auVar76._0_4_ + fVar186;
                auVar66._4_4_ =
                     (fVar74 * fVar74 *
                      (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                        0.041665796) * fVar74 + 0.16666666) * fVar74 + fVar62) + fVar74 + fVar14) *
                     auVar76._4_4_ + fVar14;
                auVar66._8_4_ =
                     (fVar194 * fVar194 *
                      (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) *
                         fVar194 + 0.041665796) * fVar194 + 0.16666666) * fVar194 + fVar192) +
                     fVar194 + fVar95) * auVar76._8_4_ + fVar95;
                auVar66._12_4_ =
                     (fVar93 * fVar93 *
                      (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                        0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar18) + fVar93 + fVar21) *
                     auVar76._12_4_ + fVar21;
                auVar76 = vrcpps_avx(auVar66);
                fVar186 = auVar76._0_4_;
                auVar67._0_4_ = auVar66._0_4_ * fVar186;
                fVar62 = auVar76._4_4_;
                auVar67._4_4_ = auVar66._4_4_ * fVar62;
                fVar14 = auVar76._8_4_;
                auVar67._8_4_ = auVar66._8_4_ * fVar14;
                fVar192 = auVar76._12_4_;
                auVar67._12_4_ = auVar66._12_4_ * fVar192;
                auVar116 = vsubps_avx(auVar87,auVar67);
                auVar76._0_4_ = fVar186 + fVar186 * auVar116._0_4_;
                auVar76._4_4_ = fVar62 + fVar62 * auVar116._4_4_;
                auVar76._8_4_ = fVar14 + fVar14 * auVar116._8_4_;
                auVar76._12_4_ = fVar192 + fVar192 * auVar116._12_4_;
                break;
              case 5:
                auVar109._8_4_ = 0x42b0c0a5;
                auVar109._0_8_ = 0x42b0c0a542b0c0a5;
                auVar109._12_4_ = 0x42b0c0a5;
                auVar76 = vminps_avx(auVar116,auVar109);
                auVar142._8_4_ = 0xc2b0c0a5;
                auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar142._12_4_ = 0xc2b0c0a5;
                auVar63 = vmaxps_avx(auVar142,auVar76);
                auVar178._0_4_ = auVar63._0_4_ * 1.442695 + fVar146;
                auVar178._4_4_ = auVar63._4_4_ * 1.442695 + fVar62;
                auVar178._8_4_ = auVar63._8_4_ * 1.442695 + fVar192;
                auVar178._12_4_ = auVar63._12_4_ * 1.442695 + fVar18;
                auVar187._0_4_ = (int)auVar178._0_4_;
                auVar187._4_4_ = (int)auVar178._4_4_;
                auVar187._8_4_ = (int)auVar178._8_4_;
                auVar187._12_4_ = (int)auVar178._12_4_;
                auVar116 = vcvtdq2ps_avx(auVar187);
                auVar76 = vcmpps_avx(auVar178,auVar116,1);
                auVar76 = vandps_avx(auVar76,auVar87);
                auVar76 = vsubps_avx(auVar116,auVar76);
                auVar188._0_4_ = auVar76._0_4_ * 0.6931472;
                auVar188._4_4_ = auVar76._4_4_ * 0.6931472;
                auVar188._8_4_ = auVar76._8_4_ * 0.6931472;
                auVar188._12_4_ = auVar76._12_4_ * 0.6931472;
                auVar116 = vsubps_avx(auVar63,auVar188);
                fVar194 = auVar116._0_4_;
                fVar93 = auVar116._4_4_;
                fVar94 = auVar116._8_4_;
                fVar195 = auVar116._12_4_;
                auVar133._0_4_ = (int)auVar76._0_4_;
                auVar133._4_4_ = (int)auVar76._4_4_;
                auVar133._8_4_ = (int)auVar76._8_4_;
                auVar133._12_4_ = (int)auVar76._12_4_;
                auVar76 = vpslld_avx(auVar133,0x17);
                auVar76 = vpaddd_avx(auVar76,auVar87);
                auVar134._0_4_ =
                     (fVar194 + fVar186 +
                     fVar194 * fVar194 *
                     (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) * fVar194
                       + 0.041665796) * fVar194 + 0.16666666) * fVar194 + fVar146)) * auVar76._0_4_
                     + fVar186;
                auVar134._4_4_ =
                     (fVar93 + fVar14 +
                     fVar93 * fVar93 *
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar62)) * auVar76._4_4_ +
                     fVar14;
                auVar134._8_4_ =
                     (fVar94 + fVar95 +
                     fVar94 * fVar94 *
                     (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                       0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar192)) * auVar76._8_4_ +
                     fVar95;
                auVar134._12_4_ =
                     (fVar195 + fVar21 +
                     fVar195 * fVar195 *
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar18)) * auVar76._12_4_
                     + fVar21;
                auVar79._8_4_ = 0x800000;
                auVar79._0_8_ = 0x80000000800000;
                auVar79._12_4_ = 0x800000;
                auVar76 = vmaxps_avx(auVar134,auVar79);
                auVar116 = vpsrld_avx(auVar76,0x17);
                auVar97._8_4_ = 0xffffff82;
                auVar97._0_8_ = 0xffffff82ffffff82;
                auVar97._12_4_ = 0xffffff82;
                auVar116 = vpaddd_avx(auVar116,auVar97);
                auVar98._8_4_ = 0x807fffff;
                auVar98._0_8_ = 0x807fffff807fffff;
                auVar98._12_4_ = 0x807fffff;
                auVar76 = vandps_avx(auVar76,auVar98);
                auVar83 = vorps_avx(auVar76,auVar111._0_16_);
                auVar63 = vcvtdq2ps_avx(auVar116);
                auVar99._8_4_ = 0x3f3504f3;
                auVar99._0_8_ = 0x3f3504f33f3504f3;
                auVar99._12_4_ = 0x3f3504f3;
                auVar116 = vcmpps_avx(auVar83,auVar99,1);
                auVar76 = vandps_avx(auVar116,auVar83);
                fVar194 = auVar83._0_4_ + -1.0 + auVar76._0_4_;
                fVar93 = auVar83._4_4_ + -1.0 + auVar76._4_4_;
                fVar94 = auVar83._8_4_ + -1.0 + auVar76._8_4_;
                fVar195 = auVar83._12_4_ + -1.0 + auVar76._12_4_;
                auVar76 = vandps_avx(auVar116,auVar87);
                auVar116 = vsubps_avx(auVar63,auVar76);
                auVar76 = vcmpps_avx(auVar134,_DAT_004ed0d0,2);
                auVar80._0_4_ =
                     (fVar194 * fVar194 *
                      (((((((((fVar194 * 0.070376836 + -0.1151461) * fVar194 + 0.116769984) *
                             fVar194 + -0.12420141) * fVar194 + 0.14249323) * fVar194 + -0.16668057)
                          * fVar194 + 0.20000714) * fVar194 + -0.24999994) * fVar194 + 0.3333333) *
                       fVar194 + -0.5) + auVar116._0_4_ * 0.6931472 + fVar194) * -2.0;
                auVar80._4_4_ =
                     (fVar93 * fVar93 *
                      (((((((((fVar93 * 0.070376836 + -0.1151461) * fVar93 + 0.116769984) * fVar93 +
                            -0.12420141) * fVar93 + 0.14249323) * fVar93 + -0.16668057) * fVar93 +
                         0.20000714) * fVar93 + -0.24999994) * fVar93 + 0.3333333) * fVar93 + -0.5)
                     + auVar116._4_4_ * 0.6931472 + fVar93) * -2.0;
                auVar80._8_4_ =
                     (fVar94 * fVar94 *
                      (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) * fVar94 +
                            -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057) * fVar94 +
                         0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333) * fVar94 + -0.5)
                     + auVar116._8_4_ * 0.6931472 + fVar94) * -2.0;
                auVar80._12_4_ =
                     (fVar195 * fVar195 *
                      (((((((((fVar195 * 0.070376836 + -0.1151461) * fVar195 + 0.116769984) *
                             fVar195 + -0.12420141) * fVar195 + 0.14249323) * fVar195 + -0.16668057)
                          * fVar195 + 0.20000714) * fVar195 + -0.24999994) * fVar195 + 0.3333333) *
                       fVar195 + -0.5) + auVar116._12_4_ * 0.6931472 + fVar195) * -2.0;
                auVar100._8_4_ = 0x7fffffff;
                auVar100._0_8_ = 0x7fffffff7fffffff;
                auVar100._12_4_ = 0x7fffffff;
                auVar76 = vblendvps_avx(auVar80,auVar100,auVar76);
                auVar101._8_4_ = 0x42b0c0a5;
                auVar101._0_8_ = 0x42b0c0a542b0c0a5;
                auVar101._12_4_ = 0x42b0c0a5;
                auVar76 = vminps_avx(auVar76,auVar101);
                auVar102._8_4_ = 0xc2b0c0a5;
                auVar102._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar102._12_4_ = 0xc2b0c0a5;
                auVar63 = vmaxps_avx(auVar76,auVar102);
                auVar103._0_4_ = auVar63._0_4_ * 1.442695 + fVar146;
                auVar103._4_4_ = auVar63._4_4_ * 1.442695 + fVar62;
                auVar103._8_4_ = auVar63._8_4_ * 1.442695 + fVar192;
                auVar103._12_4_ = auVar63._12_4_ * 1.442695 + fVar18;
                auVar135._0_4_ = (int)auVar103._0_4_;
                auVar135._4_4_ = (int)auVar103._4_4_;
                auVar135._8_4_ = (int)auVar103._8_4_;
                auVar135._12_4_ = (int)auVar103._12_4_;
                auVar116 = vcvtdq2ps_avx(auVar135);
                auVar76 = vcmpps_avx(auVar103,auVar116,1);
                auVar76 = vandps_avx(auVar76,auVar87);
                auVar76 = vsubps_avx(auVar116,auVar76);
                auVar136._0_4_ = auVar76._0_4_ * 0.6931472;
                auVar136._4_4_ = auVar76._4_4_ * 0.6931472;
                auVar136._8_4_ = auVar76._8_4_ * 0.6931472;
                auVar136._12_4_ = auVar76._12_4_ * 0.6931472;
                auVar108 = ZEXT1664(auVar87);
                auVar116 = vsubps_avx(auVar63,auVar136);
                fVar194 = auVar116._0_4_;
                fVar93 = auVar116._4_4_;
                fVar94 = auVar116._8_4_;
                fVar195 = auVar116._12_4_;
                auVar64 = ZEXT864(0) << 0x20;
                auVar111 = ZEXT1664(auVar111._0_16_);
                auVar104._0_4_ = (int)auVar76._0_4_;
                auVar104._4_4_ = (int)auVar76._4_4_;
                auVar104._8_4_ = (int)auVar76._8_4_;
                auVar104._12_4_ = (int)auVar76._12_4_;
                auVar76 = vpslld_avx(auVar104,0x17);
                auVar76 = vpaddd_avx(auVar76,auVar87);
                auVar81._0_4_ =
                     (fVar194 + fVar186 +
                     (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) * fVar194
                       + 0.041665796) * fVar194 + 0.16666666) * fVar194 + fVar146) *
                     fVar194 * fVar194) * auVar76._0_4_ + fVar186;
                auVar81._4_4_ =
                     (fVar93 + fVar14 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar62) * fVar93 * fVar93) *
                     auVar76._4_4_ + fVar14;
                auVar81._8_4_ =
                     (fVar94 + fVar95 +
                     (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                       0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar192) * fVar94 * fVar94) *
                     auVar76._8_4_ + fVar95;
                auVar81._12_4_ =
                     (fVar195 + fVar21 +
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar18) *
                     fVar195 * fVar195) * auVar76._12_4_ + fVar21;
                auVar76 = vrcpps_avx(auVar81);
                fVar186 = auVar76._0_4_;
                fVar62 = auVar76._4_4_;
                fVar14 = auVar76._8_4_;
                fVar192 = auVar76._12_4_;
                auVar82._0_4_ = auVar81._0_4_ * (fVar186 + fVar186);
                auVar82._4_4_ = auVar81._4_4_ * (fVar62 + fVar62);
                auVar82._8_4_ = auVar81._8_4_ * (fVar14 + fVar14);
                auVar82._12_4_ = auVar81._12_4_ * (fVar192 + fVar192);
                auVar110._8_4_ = 0x40000000;
                auVar110._0_8_ = 0x4000000040000000;
                auVar110._12_4_ = 0x40000000;
                auVar76 = vsubps_avx(auVar110,auVar82);
                auVar83._0_4_ = fVar186 + fVar186 + -1.0 + fVar186 * auVar76._0_4_;
                auVar83._4_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar76._4_4_;
                auVar83._8_4_ = fVar14 + fVar14 + -1.0 + fVar14 * auVar76._8_4_;
                auVar83._12_4_ = fVar192 + fVar192 + -1.0 + fVar192 * auVar76._12_4_;
                goto LAB_003de1eb;
              case 6:
                fVar186 = **(float **)(&this->field_0x120 + (long)p_Var41);
                fVar62 = (*(float **)(&this->field_0x120 + (long)p_Var41))[1];
                auVar86._0_4_ = fVar186 * auVar114._0_4_ + fVar62;
                auVar86._4_4_ = fVar186 * auVar114._4_4_ + fVar62;
                auVar86._8_4_ = fVar186 * fVar193 + fVar62;
                auVar86._12_4_ = fVar186 * fVar74 + fVar62;
                auVar76 = vmaxps_avx(auVar86,auVar63);
                auVar83 = vminps_avx(auVar76,auVar87);
LAB_003de1eb:
                auVar76._0_4_ = auVar83._0_4_ * auVar114._0_4_;
                auVar76._4_4_ = auVar83._4_4_ * auVar114._4_4_;
                auVar76._8_4_ = auVar83._8_4_ * fVar193;
                auVar76._12_4_ = auVar83._12_4_ * fVar74;
              }
switchD_003dddcd_caseD_1:
              *(undefined1 (*) [16])ppp_Var49 = auVar76;
              ppp_Var49 = ppp_Var49 + 2;
            }
          }
          pAVar43 = (Allocator *)(ulong)(uint)(iVar35 + iVar36 * 4);
          local_1f0 = pAVar44;
          local_1e8 = pAVar48;
          pAVar60 = (Allocator *)((long)&pAVar44->_vptr_Allocator + 1);
        }
      }
      else if (iVar8 == 8) {
        if ((int)_w < 1) {
          _w = 0;
        }
        if ((int)_h < 1) {
          _h = 0;
        }
        if ((int)uVar61 < 1) {
          pAVar42 = (Allocator *)0x0;
        }
        auVar141 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                      CONCAT424(0x42b0c0a5,
                                                CONCAT420(0x42b0c0a5,
                                                          CONCAT416(0x42b0c0a5,
                                                                    CONCAT412(0x42b0c0a5,
                                                                              CONCAT48(0x42b0c0a5,
                                                                                                                                                                              
                                                  0x42b0c0a542b0c0a5)))))));
        auVar143 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar144 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar111 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar114 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar147 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar155 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar163 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar64 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                     CONCAT424(0x3d2aa9c1,
                                               CONCAT420(0x3d2aa9c1,
                                                         CONCAT416(0x3d2aa9c1,
                                                                   CONCAT412(0x3d2aa9c1,
                                                                             CONCAT48(0x3d2aa9c1,
                                                                                                                                                                            
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar179 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
        pAVar60 = (Allocator *)0x0;
        for (pAVar43 = (Allocator *)0x0; pAVar44 = pAVar60, pAVar43 != pAVar42;
            pAVar43 = (Allocator *)((long)&pAVar43->_vptr_Allocator + 1)) {
          iVar35 = (int)pAVar44;
          ppp_Var49 = (_func_int ***)
                      ((long)(_func_int ***)local_238._0_8_ +
                      local_1f8 * (long)pAVar43 * local_238._16_8_);
          iVar8 = bottom_blob->w;
          sVar56 = bottom_blob->cstep;
          sVar10 = bottom_blob->elemsize;
          pvVar11 = bottom_blob->data;
          pvVar12 = (this->weight_data_tm).data;
          for (uVar53 = 0; uVar53 != _h; uVar53 = uVar53 + 1) {
            local_1e0 = this->_vptr_DeconvolutionDepthWise_x86_avx;
            local_1e8 = (Allocator *)CONCAT44(local_1e8._4_4_,uVar53);
            for (uVar61 = 0; uVar61 != _w; uVar61 = uVar61 + 1) {
              p_Var41 = local_1e0[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var41) == 0) {
                auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar171 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x1b0 + (long)p_Var41) +
                                     (long)pAVar43 * 0x20));
              }
              iVar54 = 0;
              iVar51 = *(int *)(&this->field_0xd8 + (long)p_Var41);
              if (*(int *)(&this->field_0xd8 + (long)p_Var41) < 1) {
                iVar51 = iVar54;
              }
              for (; iVar54 != iVar51; iVar54 = iVar54 + 1) {
                iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var41) * iVar54 + (uVar53 - iVar47);
                if (((-1 < iVar37) &&
                    (iVar38 = iVar37 / *(int *)(&this->field_0xe8 + (long)p_Var41),
                    iVar37 % *(int *)(&this->field_0xe8 + (long)p_Var41) == 0)) && (iVar38 < iVar59)
                   ) {
                  uVar40 = *(uint *)(&this->field_0xd4 + (long)p_Var41);
                  uVar58 = 0;
                  if (0 < (int)uVar40) {
                    uVar58 = (ulong)uVar40;
                  }
                  pfVar55 = (float *)((long)pvVar12 +
                                     (long)(int)(uVar40 * iVar54) * 0x20 + (long)iVar35 * 4);
                  for (uVar57 = 0; uVar58 != uVar57; uVar57 = uVar57 + 1) {
                    iVar37 = *(int *)(&this->field_0xdc + (long)p_Var41) * (int)uVar57 +
                             (uVar61 - iVar46);
                    if (((-1 < iVar37) &&
                        (iVar39 = iVar37 / *(int *)(&this->field_0xe4 + (long)p_Var41),
                        iVar37 % *(int *)(&this->field_0xe4 + (long)p_Var41) == 0)) &&
                       (iVar39 < iVar52)) {
                      pfVar1 = (float *)((long)pvVar11 +
                                        (long)(iVar39 << 3) * 4 +
                                        (long)iVar38 * (long)iVar8 * sVar10 +
                                        sVar56 * (long)pAVar43 * sVar10);
                      auVar171 = ZEXT3264(CONCAT428(auVar171._28_4_ + pfVar55[7],
                                                    CONCAT424(auVar171._24_4_ +
                                                              pfVar55[6] * pfVar1[6],
                                                              CONCAT420(auVar171._20_4_ +
                                                                        pfVar55[5] * pfVar1[5],
                                                                        CONCAT416(auVar171._16_4_ +
                                                                                  pfVar55[4] *
                                                                                  pfVar1[4],
                                                                                  CONCAT412(auVar171
                                                  ._12_4_ + pfVar55[3] * pfVar1[3],
                                                  CONCAT48(auVar171._8_4_ + pfVar55[2] * pfVar1[2],
                                                           CONCAT44(auVar171._4_4_ +
                                                                    pfVar55[1] * pfVar1[1],
                                                                    auVar171._0_4_ +
                                                                    *pfVar55 * *pfVar1))))))));
                    }
                    pfVar55 = pfVar55 + 8;
                  }
                }
              }
              auVar73 = auVar171._0_32_;
              auVar122 = auVar73;
              if (5 < *(int *)(&this->field_0x118 + (long)p_Var41) - 1U)
              goto switchD_003dd1bd_caseD_1;
              auVar105 = auVar108._0_32_;
              auVar122 = vmaxps_avx(auVar73,auVar105);
              fVar172 = auVar171._8_4_;
              fVar173 = auVar171._12_4_;
              fVar174 = auVar171._16_4_;
              fVar175 = auVar171._20_4_;
              fVar176 = auVar171._24_4_;
              fVar115 = auVar144._0_4_;
              fVar126 = auVar144._4_4_;
              fVar127 = auVar144._8_4_;
              fVar128 = auVar144._12_4_;
              fVar129 = auVar144._16_4_;
              fVar130 = auVar144._20_4_;
              fVar131 = auVar144._24_4_;
              auVar112 = auVar114._0_32_;
              fVar145 = auVar147._0_4_;
              fVar148 = auVar147._4_4_;
              fVar149 = auVar147._8_4_;
              fVar150 = auVar147._12_4_;
              fVar151 = auVar147._16_4_;
              fVar152 = auVar147._20_4_;
              fVar153 = auVar147._24_4_;
              fVar154 = auVar155._0_4_;
              fVar156 = auVar155._4_4_;
              fVar157 = auVar155._8_4_;
              fVar158 = auVar155._12_4_;
              fVar159 = auVar155._16_4_;
              fVar160 = auVar155._20_4_;
              fVar161 = auVar155._24_4_;
              fVar162 = auVar163._0_4_;
              fVar164 = auVar163._4_4_;
              fVar165 = auVar163._8_4_;
              fVar166 = auVar163._12_4_;
              fVar167 = auVar163._16_4_;
              fVar168 = auVar163._20_4_;
              fVar169 = auVar163._24_4_;
              fVar177 = auVar179._0_4_;
              fVar180 = auVar179._4_4_;
              fVar181 = auVar179._8_4_;
              fVar182 = auVar179._12_4_;
              fVar183 = auVar179._16_4_;
              fVar184 = auVar179._20_4_;
              fVar185 = auVar179._24_4_;
              auVar140 = auVar141._0_32_;
              auVar71 = auVar143._0_32_;
              fVar18 = auVar111._4_4_;
              fVar21 = auVar111._8_4_;
              fVar146 = auVar111._12_4_;
              fVar94 = auVar111._16_4_;
              fVar16 = auVar111._20_4_;
              fVar19 = auVar111._24_4_;
              fVar22 = auVar111._28_4_;
              fVar62 = auVar64._0_4_;
              fVar95 = auVar64._4_4_;
              fVar74 = auVar64._8_4_;
              fVar93 = auVar64._12_4_;
              fVar15 = auVar64._16_4_;
              fVar17 = auVar64._20_4_;
              fVar20 = auVar64._24_4_;
              fVar192 = auVar114._4_4_;
              fVar193 = auVar114._8_4_;
              fVar194 = auVar114._12_4_;
              fVar195 = auVar114._16_4_;
              fVar196 = auVar114._20_4_;
              fVar197 = auVar114._24_4_;
              fVar23 = auVar114._28_4_;
              fVar186 = auVar114._0_4_;
              fVar14 = auVar111._0_4_;
              switch(*(int *)(&this->field_0x118 + (long)p_Var41)) {
              case 2:
                auVar73 = vminps_avx(auVar73,auVar105);
                fVar186 = **(float **)(&this->field_0x120 + (long)p_Var41);
                auVar120._0_4_ = fVar186 * auVar73._0_4_ + auVar122._0_4_;
                auVar120._4_4_ = fVar186 * auVar73._4_4_ + auVar122._4_4_;
                auVar120._8_4_ = fVar186 * auVar73._8_4_ + auVar122._8_4_;
                auVar120._12_4_ = fVar186 * auVar73._12_4_ + auVar122._12_4_;
                auVar120._16_4_ = fVar186 * auVar73._16_4_ + auVar122._16_4_;
                auVar120._20_4_ = fVar186 * auVar73._20_4_ + auVar122._20_4_;
                auVar120._24_4_ = fVar186 * auVar73._24_4_ + auVar122._24_4_;
                auVar120._28_4_ = auVar73._28_4_ + auVar122._28_4_;
                auVar122 = auVar120;
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var41);
                auVar123._4_4_ = uVar2;
                auVar123._0_4_ = uVar2;
                auVar123._8_4_ = uVar2;
                auVar123._12_4_ = uVar2;
                auVar123._16_4_ = uVar2;
                auVar123._20_4_ = uVar2;
                auVar123._24_4_ = uVar2;
                auVar123._28_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var41))[1];
                auVar191._4_4_ = uVar2;
                auVar191._0_4_ = uVar2;
                auVar191._8_4_ = uVar2;
                auVar191._12_4_ = uVar2;
                auVar191._16_4_ = uVar2;
                auVar191._20_4_ = uVar2;
                auVar191._24_4_ = uVar2;
                auVar191._28_4_ = uVar2;
                auVar122 = vmaxps_avx(auVar73,auVar123);
                auVar122 = vminps_avx(auVar191,auVar122);
                break;
              case 4:
                auVar124._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar124._8_4_ = -fVar172;
                auVar124._12_4_ = -fVar173;
                auVar124._16_4_ = -fVar174;
                auVar124._20_4_ = -fVar175;
                auVar124._24_4_ = -fVar176;
                auVar124._28_4_ = -auVar171._28_4_;
                auVar122 = vminps_avx(auVar124,auVar140);
                auVar73 = vmaxps_avx(auVar71,auVar122);
                auVar170._0_4_ = fVar115 * auVar73._0_4_ + fVar14;
                auVar170._4_4_ = fVar126 * auVar73._4_4_ + fVar18;
                auVar170._8_4_ = fVar127 * auVar73._8_4_ + fVar21;
                auVar170._12_4_ = fVar128 * auVar73._12_4_ + fVar146;
                auVar170._16_4_ = fVar129 * auVar73._16_4_ + fVar94;
                auVar170._20_4_ = fVar130 * auVar73._20_4_ + fVar16;
                auVar170._24_4_ = fVar131 * auVar73._24_4_ + fVar19;
                auVar170._28_4_ = auVar171._28_4_ + fVar22;
                auVar105 = vroundps_avx(auVar170,1);
                auVar122 = vcmpps_avx(auVar170,auVar105,1);
                auVar122 = vandps_avx(auVar122,auVar112);
                auVar122 = vsubps_avx(auVar105,auVar122);
                fVar115 = auVar122._0_4_ * -0.6931472 + auVar73._0_4_;
                fVar126 = auVar122._4_4_ * -0.6931472 + auVar73._4_4_;
                fVar127 = auVar122._8_4_ * -0.6931472 + auVar73._8_4_;
                fVar128 = auVar122._12_4_ * -0.6931472 + auVar73._12_4_;
                fVar129 = auVar122._16_4_ * -0.6931472 + auVar73._16_4_;
                fVar130 = auVar122._20_4_ * -0.6931472 + auVar73._20_4_;
                fVar131 = auVar122._24_4_ * -0.6931472 + auVar73._24_4_;
                auVar119._0_4_ = (int)auVar122._0_4_;
                auVar119._4_4_ = (int)auVar122._4_4_;
                auVar119._8_4_ = (int)auVar122._8_4_;
                auVar119._12_4_ = (int)auVar122._12_4_;
                auVar125._16_4_ = (int)auVar122._16_4_;
                auVar125._0_16_ = auVar119;
                auVar125._20_4_ = (int)auVar122._20_4_;
                auVar125._24_4_ = (int)auVar122._24_4_;
                auVar125._28_4_ = (int)auVar122._28_4_;
                auVar116 = vpslld_avx(auVar119,0x17);
                auVar76 = vpslld_avx(auVar125._16_16_,0x17);
                auVar78._8_4_ = 0x3f800000;
                auVar78._0_8_ = 0x3f8000003f800000;
                auVar78._12_4_ = 0x3f800000;
                auVar76 = vpaddd_avx(auVar76,auVar78);
                auVar116 = vpaddd_avx(auVar116,auVar78);
                auVar72._0_4_ =
                     (fVar115 + fVar186 +
                     fVar115 * fVar115 *
                     ((fVar177 +
                      ((fVar162 + (fVar154 + fVar145 * fVar115) * fVar115) * fVar115 + fVar62) *
                      fVar115) * fVar115 + fVar14)) * auVar116._0_4_ + fVar186;
                auVar72._4_4_ =
                     (fVar126 + fVar192 +
                     fVar126 * fVar126 *
                     ((fVar180 +
                      ((fVar164 + (fVar156 + fVar148 * fVar126) * fVar126) * fVar126 + fVar95) *
                      fVar126) * fVar126 + fVar18)) * auVar116._4_4_ + fVar192;
                auVar72._8_4_ =
                     (fVar127 + fVar193 +
                     fVar127 * fVar127 *
                     ((fVar181 +
                      ((fVar165 + (fVar157 + fVar149 * fVar127) * fVar127) * fVar127 + fVar74) *
                      fVar127) * fVar127 + fVar21)) * auVar116._8_4_ + fVar193;
                auVar72._12_4_ =
                     (fVar128 + fVar194 +
                     fVar128 * fVar128 *
                     ((fVar182 +
                      ((fVar166 + (fVar158 + fVar150 * fVar128) * fVar128) * fVar128 + fVar93) *
                      fVar128) * fVar128 + fVar146)) * auVar116._12_4_ + fVar194;
                auVar72._16_4_ =
                     (fVar129 + fVar195 +
                     fVar129 * fVar129 *
                     ((fVar183 +
                      ((fVar167 + (fVar159 + fVar151 * fVar129) * fVar129) * fVar129 + fVar15) *
                      fVar129) * fVar129 + fVar94)) * auVar76._0_4_ + fVar195;
                auVar72._20_4_ =
                     (fVar130 + fVar196 +
                     fVar130 * fVar130 *
                     ((fVar184 +
                      ((fVar168 + (fVar160 + fVar152 * fVar130) * fVar130) * fVar130 + fVar17) *
                      fVar130) * fVar130 + fVar16)) * auVar76._4_4_ + fVar196;
                auVar72._24_4_ =
                     (fVar131 + fVar197 +
                     fVar131 * fVar131 *
                     ((fVar185 +
                      ((fVar169 + (fVar161 + fVar153 * fVar131) * fVar131) * fVar131 + fVar20) *
                      fVar131) * fVar131 + fVar19)) * auVar76._8_4_ + fVar197;
                auVar72._28_4_ =
                     auVar105._28_4_ + auVar73._28_4_ + fVar23 +
                     auVar179._28_4_ +
                     auVar163._28_4_ + auVar155._28_4_ + -0.6931472 + auVar64._28_4_ + fVar22 +
                     fVar23;
                auVar73 = vrcpps_avx(auVar72);
                fVar186 = auVar73._0_4_;
                fVar62 = auVar73._4_4_;
                auVar32._4_4_ = auVar72._4_4_ * fVar62;
                auVar32._0_4_ = auVar72._0_4_ * fVar186;
                fVar14 = auVar73._8_4_;
                auVar32._8_4_ = auVar72._8_4_ * fVar14;
                fVar192 = auVar73._12_4_;
                auVar32._12_4_ = auVar72._12_4_ * fVar192;
                fVar95 = auVar73._16_4_;
                auVar32._16_4_ = auVar72._16_4_ * fVar95;
                fVar18 = auVar73._20_4_;
                auVar32._20_4_ = auVar72._20_4_ * fVar18;
                fVar21 = auVar73._24_4_;
                auVar32._24_4_ = auVar72._24_4_ * fVar21;
                auVar32._28_4_ = auVar72._28_4_;
                auVar105 = vsubps_avx(auVar112,auVar32);
                auVar122._0_4_ = fVar186 + fVar186 * auVar105._0_4_;
                auVar122._4_4_ = fVar62 + fVar62 * auVar105._4_4_;
                auVar122._8_4_ = fVar14 + fVar14 * auVar105._8_4_;
                auVar122._12_4_ = fVar192 + fVar192 * auVar105._12_4_;
                auVar122._16_4_ = fVar95 + fVar95 * auVar105._16_4_;
                auVar122._20_4_ = fVar18 + fVar18 * auVar105._20_4_;
                auVar122._24_4_ = fVar21 + fVar21 * auVar105._24_4_;
                auVar122._28_4_ = auVar73._28_4_ + auVar105._28_4_;
                break;
              case 5:
                auVar73 = vminps_avx(auVar73,auVar140);
                auVar73 = vmaxps_avx(auVar71,auVar73);
                auVar121._0_4_ = fVar115 * auVar73._0_4_ + fVar14;
                auVar121._4_4_ = fVar126 * auVar73._4_4_ + fVar18;
                auVar121._8_4_ = fVar127 * auVar73._8_4_ + fVar21;
                auVar121._12_4_ = fVar128 * auVar73._12_4_ + fVar146;
                auVar121._16_4_ = fVar129 * auVar73._16_4_ + fVar94;
                auVar121._20_4_ = fVar130 * auVar73._20_4_ + fVar16;
                auVar121._24_4_ = fVar131 * auVar73._24_4_ + fVar19;
                auVar121._28_4_ = auVar122._28_4_ + fVar22;
                auVar105 = vroundps_avx(auVar121,1);
                auVar122 = vcmpps_avx(auVar121,auVar105,1);
                auVar122 = vandps_avx(auVar122,auVar112);
                auVar122 = vsubps_avx(auVar105,auVar122);
                auVar112._4_4_ = auVar122._4_4_ * 0.6931472;
                auVar112._0_4_ = auVar122._0_4_ * 0.6931472;
                auVar112._8_4_ = auVar122._8_4_ * 0.6931472;
                auVar112._12_4_ = auVar122._12_4_ * 0.6931472;
                auVar112._16_4_ = auVar122._16_4_ * 0.6931472;
                auVar112._20_4_ = auVar122._20_4_ * 0.6931472;
                auVar112._24_4_ = auVar122._24_4_ * 0.6931472;
                auVar112._28_4_ = auVar105._28_4_;
                auVar73 = vsubps_avx(auVar73,auVar112);
                fVar24 = auVar73._0_4_;
                fVar25 = auVar73._4_4_;
                fVar26 = auVar73._8_4_;
                fVar27 = auVar73._12_4_;
                fVar28 = auVar73._16_4_;
                fVar29 = auVar73._20_4_;
                fVar30 = auVar73._24_4_;
                auVar75._0_4_ = (int)auVar122._0_4_;
                auVar75._4_4_ = (int)auVar122._4_4_;
                auVar75._8_4_ = (int)auVar122._8_4_;
                auVar75._12_4_ = (int)auVar122._12_4_;
                auVar88._16_4_ = (int)auVar122._16_4_;
                auVar88._0_16_ = auVar75;
                auVar88._20_4_ = (int)auVar122._20_4_;
                auVar88._24_4_ = (int)auVar122._24_4_;
                auVar88._28_4_ = (int)auVar122._28_4_;
                auVar116 = vpslld_avx(auVar75,0x17);
                auVar76 = vpslld_avx(auVar88._16_16_,0x17);
                auVar96._8_4_ = 0x3f800000;
                auVar96._0_8_ = 0x3f8000003f800000;
                auVar96._12_4_ = 0x3f800000;
                auVar76 = vpaddd_avx(auVar76,auVar96);
                auVar116 = vpaddd_avx(auVar116,auVar96);
                auVar89._0_4_ =
                     (fVar24 + fVar186 +
                     fVar24 * fVar24 *
                     ((fVar177 +
                      ((fVar162 + (fVar154 + fVar145 * fVar24) * fVar24) * fVar24 + fVar62) * fVar24
                      ) * fVar24 + fVar14)) * auVar116._0_4_ + fVar186;
                auVar89._4_4_ =
                     (fVar25 + fVar192 +
                     fVar25 * fVar25 *
                     ((fVar180 +
                      ((fVar164 + (fVar156 + fVar148 * fVar25) * fVar25) * fVar25 + fVar95) * fVar25
                      ) * fVar25 + fVar18)) * auVar116._4_4_ + fVar192;
                auVar89._8_4_ =
                     (fVar26 + fVar193 +
                     fVar26 * fVar26 *
                     ((fVar181 +
                      ((fVar165 + (fVar157 + fVar149 * fVar26) * fVar26) * fVar26 + fVar74) * fVar26
                      ) * fVar26 + fVar21)) * auVar116._8_4_ + fVar193;
                auVar89._12_4_ =
                     (fVar27 + fVar194 +
                     fVar27 * fVar27 *
                     ((fVar182 +
                      ((fVar166 + (fVar158 + fVar150 * fVar27) * fVar27) * fVar27 + fVar93) * fVar27
                      ) * fVar27 + fVar146)) * auVar116._12_4_ + fVar194;
                auVar89._16_4_ =
                     (fVar28 + fVar195 +
                     fVar28 * fVar28 *
                     ((fVar183 +
                      ((fVar167 + (fVar159 + fVar151 * fVar28) * fVar28) * fVar28 + fVar15) * fVar28
                      ) * fVar28 + fVar94)) * auVar76._0_4_ + fVar195;
                auVar89._20_4_ =
                     (fVar29 + fVar196 +
                     fVar29 * fVar29 *
                     ((fVar184 +
                      ((fVar168 + (fVar160 + fVar152 * fVar29) * fVar29) * fVar29 + fVar17) * fVar29
                      ) * fVar29 + fVar16)) * auVar76._4_4_ + fVar196;
                auVar89._24_4_ =
                     (fVar30 + fVar197 +
                     fVar30 * fVar30 *
                     ((fVar185 +
                      ((fVar169 + (fVar161 + fVar153 * fVar30) * fVar30) * fVar30 + fVar20) * fVar30
                      ) * fVar30 + fVar19)) * auVar76._8_4_ + fVar197;
                auVar89._28_4_ =
                     auVar73._28_4_ + fVar23 +
                     auVar179._28_4_ +
                     auVar163._28_4_ + auVar155._28_4_ + 0.6931472 + auVar64._28_4_ + fVar22 +
                     fVar23;
                auVar69._8_4_ = 0x800000;
                auVar69._0_8_ = 0x80000000800000;
                auVar69._12_4_ = 0x800000;
                auVar69._16_4_ = 0x800000;
                auVar69._20_4_ = 0x800000;
                auVar69._24_4_ = 0x800000;
                auVar69._28_4_ = 0x800000;
                auVar105 = vmaxps_avx(auVar89,auVar69);
                auVar76 = vpsrld_avx(auVar105._16_16_,0x17);
                auVar106._8_4_ = 0x807fffff;
                auVar106._0_8_ = 0x807fffff807fffff;
                auVar106._12_4_ = 0x807fffff;
                auVar106._16_4_ = 0x807fffff;
                auVar106._20_4_ = 0x807fffff;
                auVar106._24_4_ = 0x807fffff;
                auVar106._28_4_ = 0x807fffff;
                auVar122 = vandps_avx(auVar105,auVar106);
                auVar112 = vorps_avx(auVar122,auVar111._0_32_);
                auVar107._8_4_ = 0x3f3504f3;
                auVar107._0_8_ = 0x3f3504f33f3504f3;
                auVar107._12_4_ = 0x3f3504f3;
                auVar107._16_4_ = 0x3f3504f3;
                auVar107._20_4_ = 0x3f3504f3;
                auVar107._24_4_ = 0x3f3504f3;
                auVar107._28_4_ = 0x3f3504f3;
                auVar73 = vcmpps_avx(auVar107,auVar112,2);
                auVar122 = vandnps_avx(auVar73,auVar112);
                fVar186 = auVar112._0_4_ + -1.0 + auVar122._0_4_;
                fVar192 = auVar112._4_4_ + -1.0 + auVar122._4_4_;
                fVar193 = auVar112._8_4_ + -1.0 + auVar122._8_4_;
                fVar194 = auVar112._12_4_ + -1.0 + auVar122._12_4_;
                fVar195 = auVar112._16_4_ + -1.0 + auVar122._16_4_;
                fVar196 = auVar112._20_4_ + -1.0 + auVar122._20_4_;
                fVar197 = auVar112._24_4_ + -1.0 + auVar122._24_4_;
                auVar76 = vpsubd_avx(auVar76,auVar73._16_16_);
                auVar141 = ZEXT3264(auVar140);
                auVar143 = ZEXT3264(auVar71);
                auVar144 = ZEXT3264(auVar144._0_32_);
                auVar147 = ZEXT3264(auVar147._0_32_);
                auVar155 = ZEXT3264(auVar155._0_32_);
                auVar163 = ZEXT3264(auVar163._0_32_);
                auVar64 = ZEXT3264(auVar64._0_32_);
                auVar111 = ZEXT3264(auVar111._0_32_);
                auVar179 = ZEXT3264(auVar179._0_32_);
                auVar113._8_4_ = 0x3f800000;
                auVar113._0_8_ = 0x3f8000003f800000;
                auVar113._12_4_ = 0x3f800000;
                auVar113._16_4_ = 0x3f800000;
                auVar113._20_4_ = 0x3f800000;
                auVar113._24_4_ = 0x3f800000;
                auVar113._28_4_ = 0x3f800000;
                auVar114 = ZEXT3264(auVar113);
                auVar116 = vpsrld_avx(auVar105._0_16_,0x17);
                auVar117._8_4_ = 0xffffff81;
                auVar117._0_8_ = 0xffffff81ffffff81;
                auVar117._12_4_ = 0xffffff81;
                auVar76 = vpaddd_avx(auVar76,auVar117);
                auVar116 = vpsubd_avx(auVar116,auVar73._0_16_);
                auVar116 = vpaddd_avx(auVar116,auVar117);
                auVar70._16_16_ = auVar76;
                auVar70._0_16_ = auVar116;
                auVar73 = vcmpps_avx(auVar89,_DAT_004f1d40,2);
                auVar105 = vcvtdq2ps_avx(auVar70);
                auVar31._4_4_ =
                     (fVar192 + auVar105._4_4_ * 0.6931472 +
                     fVar192 * fVar192 *
                     (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (
                                                  fVar192 * (fVar192 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._0_4_ =
                     (fVar186 + auVar105._0_4_ * 0.6931472 +
                     fVar186 * fVar186 *
                     (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (
                                                  fVar186 * (fVar186 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._8_4_ =
                     (fVar193 + auVar105._8_4_ * 0.6931472 +
                     fVar193 * fVar193 *
                     (fVar193 * (fVar193 * (fVar193 * (fVar193 * (fVar193 * (fVar193 * (fVar193 * (
                                                  fVar193 * (fVar193 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._12_4_ =
                     (fVar194 + auVar105._12_4_ * 0.6931472 +
                     fVar194 * fVar194 *
                     (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (
                                                  fVar194 * (fVar194 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._16_4_ =
                     (fVar195 + auVar105._16_4_ * 0.6931472 +
                     fVar195 * fVar195 *
                     (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (
                                                  fVar195 * (fVar195 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._20_4_ =
                     (fVar196 + auVar105._20_4_ * 0.6931472 +
                     fVar196 * fVar196 *
                     (fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * (
                                                  fVar196 * (fVar196 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._24_4_ =
                     (fVar197 + auVar105._24_4_ * 0.6931472 +
                     fVar197 * fVar197 *
                     (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (
                                                  fVar197 * (fVar197 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._28_4_ = auVar112._28_4_ + -1.0 + auVar122._28_4_ + auVar105._28_4_ + 0.0;
                auVar90._8_4_ = 0x7fffffff;
                auVar90._0_8_ = 0x7fffffff7fffffff;
                auVar90._12_4_ = 0x7fffffff;
                auVar90._16_4_ = 0x7fffffff;
                auVar90._20_4_ = 0x7fffffff;
                auVar90._24_4_ = 0x7fffffff;
                auVar90._28_4_ = 0x7fffffff;
                auVar122 = vblendvps_avx(auVar31,auVar90,auVar73);
                auVar122 = vminps_avx(auVar122,auVar140);
                auVar73 = vmaxps_avx(auVar71,auVar122);
                auVar91._0_4_ = fVar115 * auVar73._0_4_ + fVar14;
                auVar91._4_4_ = fVar126 * auVar73._4_4_ + fVar18;
                auVar91._8_4_ = fVar127 * auVar73._8_4_ + fVar21;
                auVar91._12_4_ = fVar128 * auVar73._12_4_ + fVar146;
                auVar91._16_4_ = fVar129 * auVar73._16_4_ + fVar94;
                auVar91._20_4_ = fVar130 * auVar73._20_4_ + fVar16;
                auVar91._24_4_ = fVar131 * auVar73._24_4_ + fVar19;
                auVar91._28_4_ = fVar22 + NAN;
                auVar105 = vroundps_avx(auVar91,1);
                auVar122 = vcmpps_avx(auVar91,auVar105,1);
                auVar122 = vandps_avx(auVar122,auVar113);
                auVar122 = vsubps_avx(auVar105,auVar122);
                auVar140._4_4_ = auVar122._4_4_ * 0.6931472;
                auVar140._0_4_ = auVar122._0_4_ * 0.6931472;
                auVar140._8_4_ = auVar122._8_4_ * 0.6931472;
                auVar140._12_4_ = auVar122._12_4_ * 0.6931472;
                auVar140._16_4_ = auVar122._16_4_ * 0.6931472;
                auVar140._20_4_ = auVar122._20_4_ * 0.6931472;
                auVar140._24_4_ = auVar122._24_4_ * 0.6931472;
                auVar140._28_4_ = auVar105._28_4_;
                auVar73 = vsubps_avx(auVar73,auVar140);
                fVar186 = auVar73._0_4_;
                fVar192 = auVar73._4_4_;
                fVar193 = auVar73._8_4_;
                fVar194 = auVar73._12_4_;
                fVar195 = auVar73._16_4_;
                fVar196 = auVar73._20_4_;
                fVar197 = auVar73._24_4_;
                auVar77._0_4_ = (int)auVar122._0_4_;
                auVar77._4_4_ = (int)auVar122._4_4_;
                auVar77._8_4_ = (int)auVar122._8_4_;
                auVar77._12_4_ = (int)auVar122._12_4_;
                auVar92._16_4_ = (int)auVar122._16_4_;
                auVar92._0_16_ = auVar77;
                auVar92._20_4_ = (int)auVar122._20_4_;
                auVar92._24_4_ = (int)auVar122._24_4_;
                auVar92._28_4_ = (int)auVar122._28_4_;
                auVar116 = vpslld_avx(auVar77,0x17);
                auVar76 = vpslld_avx(auVar92._16_16_,0x17);
                auVar118._8_4_ = 0x3f800000;
                auVar118._0_8_ = 0x3f8000003f800000;
                auVar118._12_4_ = 0x3f800000;
                auVar76 = vpaddd_avx(auVar76,auVar118);
                auVar116 = vpaddd_avx(auVar116,auVar118);
                auVar71._0_4_ =
                     (fVar186 + 1.0 +
                     fVar186 * fVar186 *
                     ((fVar177 +
                      ((fVar162 + (fVar154 + fVar145 * fVar186) * fVar186) * fVar186 + fVar62) *
                      fVar186) * fVar186 + fVar14)) * auVar116._0_4_ + 1.0;
                auVar71._4_4_ =
                     (fVar192 + 1.0 +
                     fVar192 * fVar192 *
                     ((fVar180 +
                      ((fVar164 + (fVar156 + fVar148 * fVar192) * fVar192) * fVar192 + fVar95) *
                      fVar192) * fVar192 + fVar18)) * auVar116._4_4_ + 1.0;
                auVar71._8_4_ =
                     (fVar193 + 1.0 +
                     fVar193 * fVar193 *
                     ((fVar181 +
                      ((fVar165 + (fVar157 + fVar149 * fVar193) * fVar193) * fVar193 + fVar74) *
                      fVar193) * fVar193 + fVar21)) * auVar116._8_4_ + 1.0;
                auVar71._12_4_ =
                     (fVar194 + 1.0 +
                     fVar194 * fVar194 *
                     ((fVar182 +
                      ((fVar166 + (fVar158 + fVar150 * fVar194) * fVar194) * fVar194 + fVar93) *
                      fVar194) * fVar194 + fVar146)) * auVar116._12_4_ + 1.0;
                auVar71._16_4_ =
                     (fVar195 + 1.0 +
                     fVar195 * fVar195 *
                     ((fVar183 +
                      ((fVar167 + (fVar159 + fVar151 * fVar195) * fVar195) * fVar195 + fVar15) *
                      fVar195) * fVar195 + fVar94)) * auVar76._0_4_ + 1.0;
                auVar71._20_4_ =
                     (fVar196 + 1.0 +
                     fVar196 * fVar196 *
                     ((fVar184 +
                      ((fVar168 + (fVar160 + fVar152 * fVar196) * fVar196) * fVar196 + fVar17) *
                      fVar196) * fVar196 + fVar16)) * auVar76._4_4_ + 1.0;
                auVar71._24_4_ =
                     (fVar197 + 1.0 +
                     fVar197 * fVar197 *
                     ((fVar185 +
                      ((fVar169 + (fVar161 + fVar153 * fVar197) * fVar197) * fVar197 + fVar20) *
                      fVar197) * fVar197 + fVar19)) * auVar76._8_4_ + 1.0;
                auVar71._28_4_ = auVar73._28_4_ + 1.0 + auVar105._28_4_ + 1.0;
                auVar122 = vrcpps_avx(auVar71);
                fVar186 = auVar122._0_4_;
                fVar62 = auVar122._4_4_;
                fVar14 = auVar122._8_4_;
                fVar192 = auVar122._12_4_;
                fVar95 = auVar122._16_4_;
                fVar18 = auVar122._20_4_;
                fVar21 = auVar122._24_4_;
                auVar105._4_4_ = auVar71._4_4_ * (fVar62 + fVar62);
                auVar105._0_4_ = auVar71._0_4_ * (fVar186 + fVar186);
                auVar105._8_4_ = auVar71._8_4_ * (fVar14 + fVar14);
                auVar105._12_4_ = auVar71._12_4_ * (fVar192 + fVar192);
                auVar105._16_4_ = auVar71._16_4_ * (fVar95 + fVar95);
                auVar105._20_4_ = auVar71._20_4_ * (fVar18 + fVar18);
                auVar105._24_4_ = auVar71._24_4_ * (fVar21 + fVar21);
                auVar105._28_4_ = auVar71._28_4_;
                auVar122._8_4_ = 2.0;
                auVar122._0_8_ = 0x4000000040000000;
                auVar122._12_4_ = 2.0;
                auVar122._16_4_ = 2.0;
                auVar122._20_4_ = 2.0;
                auVar122._24_4_ = 2.0;
                auVar122._28_4_ = 2.0;
                auVar73 = vsubps_avx(auVar122,auVar105);
                auVar108 = ZEXT464(0) << 0x20;
                auVar68._0_4_ = fVar186 + fVar186 + -1.0 + fVar186 * auVar73._0_4_;
                auVar68._4_4_ = fVar62 + fVar62 + -1.0 + fVar62 * auVar73._4_4_;
                auVar68._8_4_ = fVar14 + fVar14 + -1.0 + fVar14 * auVar73._8_4_;
                auVar68._12_4_ = fVar192 + fVar192 + -1.0 + fVar192 * auVar73._12_4_;
                auVar68._16_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar73._16_4_;
                auVar68._20_4_ = fVar18 + fVar18 + -1.0 + fVar18 * auVar73._20_4_;
                auVar68._24_4_ = fVar21 + fVar21 + -1.0 + fVar21 * auVar73._24_4_;
                goto LAB_003dd620;
              case 6:
                fVar186 = **(float **)(&this->field_0x120 + (long)p_Var41);
                fVar62 = (*(float **)(&this->field_0x120 + (long)p_Var41))[1];
                auVar73._0_4_ = auVar171._0_4_ * fVar186 + fVar62;
                auVar73._4_4_ = auVar171._4_4_ * fVar186 + fVar62;
                auVar73._8_4_ = fVar172 * fVar186 + fVar62;
                auVar73._12_4_ = fVar173 * fVar186 + fVar62;
                auVar73._16_4_ = fVar174 * fVar186 + fVar62;
                auVar73._20_4_ = fVar175 * fVar186 + fVar62;
                auVar73._24_4_ = fVar176 * fVar186 + fVar62;
                auVar73._28_4_ = fVar186 + fVar62;
                auVar73 = vmaxps_avx(auVar73,auVar105);
                auVar73 = vminps_avx(auVar73,auVar112);
                auVar68 = auVar73._0_28_;
LAB_003dd620:
                auVar33._4_4_ = auVar171._4_4_ * auVar68._4_4_;
                auVar33._0_4_ = auVar171._0_4_ * auVar68._0_4_;
                auVar33._8_4_ = fVar172 * auVar68._8_4_;
                auVar33._12_4_ = fVar173 * auVar68._12_4_;
                auVar33._16_4_ = fVar174 * auVar68._16_4_;
                auVar33._20_4_ = fVar175 * auVar68._20_4_;
                auVar33._24_4_ = fVar176 * auVar68._24_4_;
                auVar33._28_4_ = auVar122._28_4_;
                auVar122 = auVar33;
              }
switchD_003dd1bd_caseD_1:
              *(undefined1 (*) [32])ppp_Var49 = auVar122;
              ppp_Var49 = ppp_Var49 + 4;
            }
          }
          pAVar60 = (Allocator *)(ulong)(uint)(iVar35 + iVar36 * 8);
          local_1f0 = pAVar44;
        }
      }
    }
    else {
      uVar58 = (long)iVar35 / (long)iVar36;
      uVar57 = (long)*(int *)(&this->field_0xd0 + (long)p_Var41) / (long)iVar36;
      if (opt->use_packing_layout == true) {
        uVar61 = (uint)((uVar58 & 3) == 0) * 3 + 1;
        if ((uVar58 & 7) == 0) {
          uVar61 = 8;
        }
        uVar40 = (uint)((uVar57 & 3) == 0) * 3 + 1;
        if ((uVar57 & 7) == 0) {
          uVar40 = 8;
        }
      }
      else {
        uVar61 = 1;
        uVar40 = uVar61;
      }
      piVar9 = bottom_blob->refcount;
      local_178.data = bottom_blob->data;
      local_178.refcount = bottom_blob->refcount;
      local_178.elemsize = bottom_blob->elemsize;
      local_178.elempack = bottom_blob->elempack;
      local_178.allocator = bottom_blob->allocator;
      local_178.dims = bottom_blob->dims;
      local_178.w = bottom_blob->w;
      local_178.h = bottom_blob->h;
      local_178.d = bottom_blob->d;
      local_178.c = bottom_blob->c;
      local_178.cstep = bottom_blob->cstep;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      if ((int)uVar61 < iVar8) {
        opt_p.lightmode = opt->lightmode;
        opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_basic = opt->use_subgroup_basic;
        opt_p.use_subgroup_vote = opt->use_subgroup_vote;
        opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_reserved_7 = opt->use_reserved_7;
        opt_p.use_reserved_8 = opt->use_reserved_8;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_178,uVar61,&opt_p);
      }
      sVar10 = local_1f8;
      piVar9 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
      opt_p.blob_allocator = (Allocator *)CONCAT44(local_238._12_4_,local_238._8_4_);
      opt_p.lightmode = (bool)local_238[0];
      opt_p._1_3_ = local_238._1_3_;
      opt_p.num_threads = local_238._4_4_;
      opt_p.workspace_allocator = (Allocator *)local_238._16_8_;
      opt_p.openmp_blocktime = local_238._24_4_;
      opt_p.use_bf16_storage = (bool)local_238[0x20];
      opt_p.use_fp16_packed = (bool)local_238[0x21];
      opt_p.use_fp16_storage = (bool)local_238[0x22];
      opt_p.use_fp16_arithmetic = (bool)local_238[0x23];
      opt_p.use_int8_packed = (bool)local_238[0x24];
      opt_p.use_int8_storage = (bool)local_238[0x25];
      opt_p.use_int8_arithmetic = (bool)local_238[0x26];
      opt_p.use_packing_layout = (bool)local_238[0x27];
      opt_p._44_4_ = local_238._44_4_;
      opt_p._40_4_ = local_238._40_4_;
      opt_p.flush_denormals = local_238._48_4_;
      opt_p.use_local_pool_allocator = (bool)local_238[0x34];
      opt_p.use_shader_local_memory = (bool)local_238[0x35];
      opt_p.use_cooperative_matrix = (bool)local_238[0x36];
      opt_p.use_winograd23_convolution = (bool)local_238[0x37];
      opt_p.use_winograd43_convolution = (bool)(undefined1)local_200;
      opt_p.use_winograd63_convolution = (bool)local_200._1_1_;
      opt_p.use_a53_a55_optimized_kernel = (bool)local_200._2_1_;
      opt_p.use_reserved_7 = (bool)local_200._3_1_;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      if ((uVar40 < uVar53) &&
         ((Mat::create((Mat *)&opt_p,_w,_h,
                       *(int *)(&this->field_0xd0 +
                               (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]) / (int)uVar40,
                       (ulong)uVar40 * (sVar56 / uVar53),uVar40,opt->workspace_allocator),
          opt_p._0_8_ == 0 || ((long)(int)opt_p._56_4_ * sVar10 == 0)))) {
        iVar52 = -100;
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
        if (local_178.refcount != (int *)0x0) {
          LOCK();
          *local_178.refcount = *local_178.refcount + -1;
          UNLOCK();
          if (*local_178.refcount == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              free(local_178.data);
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_003de6e7;
      }
      iVar59 = 0;
      iVar52 = 0;
      for (lVar45 = 0;
          lVar45 < *(int *)(&this->field_0x114 +
                           (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]);
          lVar45 = lVar45 + 1) {
        m.c = (int)uVar58 / (int)uVar61;
        m.data = (void *)((long)(iVar59 / (int)uVar61) * local_178.cstep * local_178.elemsize +
                         (long)local_178.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_178.elemsize;
        m.elempack = local_178.elempack;
        m.allocator = local_178.allocator;
        m.cstep = ((long)local_178.d * local_178.elemsize * (long)local_178.h * (long)local_178.w +
                   0xf & 0xfffffffffffffff0) / local_178.elemsize;
        m.dims = local_178.dims;
        m.w = local_178.w;
        m.h = local_178.h;
        m.d = local_178.d;
        m_1.c = (int)uVar57 / (int)uVar40;
        m_1.data = (void *)((long)(iVar52 / (int)uVar40) * sVar10 * (long)opt_p.workspace_allocator
                           + opt_p._0_8_);
        m_1.refcount = (int *)0x0;
        m_1.elemsize = (size_t)opt_p.workspace_allocator;
        m_1.elempack = opt_p.openmp_blocktime;
        m_1.allocator = (Allocator *)opt_p._32_8_;
        m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                     (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
        m_1._40_8_ = opt_p._40_8_;
        m_1._48_8_ = opt_p._48_8_;
        pLVar13 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar45];
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
        (*pLVar13->_vptr_Layer[7])(pLVar13,&m,&m_1,&opt_g);
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar52 = iVar52 + (int)uVar57;
        iVar59 = iVar59 + (int)uVar58;
      }
      if (uVar40 < uVar53) {
        convert_packing((Mat *)&opt_p,(Mat *)local_238,uVar53,opt);
      }
      else {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar9 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
              free((void *)local_238._0_8_);
            }
            else {
              (*(*(_func_int ***)local_238._32_8_)[3])();
            }
          }
        }
        uVar34 = opt_p._56_8_;
        local_238[0] = opt_p.lightmode;
        local_238._1_3_ = opt_p._1_3_;
        local_238._4_4_ = opt_p.num_threads;
        local_238._8_4_ = SUB84(opt_p.blob_allocator,0);
        local_238._12_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
        local_238._16_8_ = opt_p.workspace_allocator;
        local_238._24_4_ = opt_p.openmp_blocktime;
        local_238[0x20] = opt_p.use_bf16_storage;
        local_238[0x21] = opt_p.use_fp16_packed;
        local_238[0x22] = opt_p.use_fp16_storage;
        local_238[0x23] = opt_p.use_fp16_arithmetic;
        local_238[0x24] = opt_p.use_int8_packed;
        local_238[0x25] = opt_p.use_int8_storage;
        local_238[0x26] = opt_p.use_int8_arithmetic;
        local_238[0x27] = opt_p.use_packing_layout;
        local_238._40_4_ = opt_p._40_4_;
        local_238._44_4_ = opt_p._44_4_;
        local_238._48_4_ = opt_p.flush_denormals;
        local_238[0x34] = opt_p.use_local_pool_allocator;
        local_238[0x35] = opt_p.use_shader_local_memory;
        local_238[0x36] = opt_p.use_cooperative_matrix;
        local_238[0x37] = opt_p.use_winograd23_convolution;
        local_200._0_1_ = opt_p.use_winograd43_convolution;
        local_200._1_1_ = opt_p.use_winograd63_convolution;
        local_200._2_1_ = opt_p.use_a53_a55_optimized_kernel;
        local_200._3_1_ = opt_p.use_reserved_7;
        local_1f8 = sVar10;
        opt_p._56_8_ = uVar34;
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + -1;
        UNLOCK();
        if (*local_178.refcount == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx +
               (long)this->_vptr_DeconvolutionDepthWise_x86_avx[-3]),(Mat *)local_238,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && (iVar52 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_003de6e7;
  }
  iVar52 = -100;
LAB_003de6e7:
  piVar9 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        free((void *)local_238._0_8_);
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}